

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  string *message;
  JUnitTestCaseData *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  string *details;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [56];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  message = (string *)String::c_str((String *)0x21b8d9);
  details = (string *)&local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  JUnitTestCaseData::addError(in_RDI,message,details);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21b950);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            testCaseData.addError("exception", e.error_string.c_str());
        }